

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGenerator.cpp
# Opt level: O3

tuple<SudokuGitter,_SudokuGitter> * __thiscall
SudokuGenerator::generateNewBig
          (tuple<SudokuGitter,_SudokuGitter> *__return_storage_ptr__,SudokuGenerator *this)

{
  SudokuGenerator *pSVar1;
  SudokuGitter untenRechts;
  SudokuGitter linksOben;
  vector<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
  local_80;
  SudokuGitter local_68;
  SudokuGitter local_40;
  
  pSVar1 = (SudokuGenerator *)operator_new(0x48);
  SudokuGenerator(pSVar1,this->elementCount);
  generateNew(&local_68,pSVar1);
  pSVar1 = (SudokuGenerator *)operator_new(0x48);
  SudokuGenerator(pSVar1,this->elementCount);
  SudokuGitter::getQuad
            (&local_80,&local_68,(this->gitter).quadHeight - 1,(this->gitter).quadWidth - 1);
  SudokuGitter::setQuadPermanent(&pSVar1->gitter,0,0,&local_80);
  std::
  vector<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
  ::~vector(&local_80);
  generateNewFromRow(&local_40,pSVar1,0);
  std::_Tuple_impl<0ul,SudokuGitter,SudokuGitter>::_Tuple_impl<SudokuGitter&,SudokuGitter&,void>
            ((_Tuple_impl<0ul,SudokuGitter,SudokuGitter> *)__return_storage_ptr__,&local_68,
             &local_40);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_40.cells);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_68.cells);
  return __return_storage_ptr__;
}

Assistant:

tuple<SudokuGitter, SudokuGitter> SudokuGenerator::generateNewBig() {
    SudokuGenerator *untenRechtsGen = new SudokuGenerator(elementCount);
    SudokuGitter untenRechts = untenRechtsGen->generateNew();

    SudokuGenerator *linksObenGen = new SudokuGenerator(elementCount);
    linksObenGen->gitter.setQuadPermanent(0, 0,
                                          untenRechts.getQuad(gitter.getQuadHeight() - 1, gitter.getQuadWidth() - 1));
    SudokuGitter linksOben = linksObenGen->generateNewFromRow(0);

    //printCelVecValPtr(untenRechts.getQuad(gitter.getQuadHeight() - 1, gitter.getQuadWidth() - 1), "LinksObenUebernehmen");

    return tuple<SudokuGitter, SudokuGitter>(untenRechts, linksOben);
}